

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O1

void __thiscall
jsoncons::csv::basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::
read_next(basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
         basic_json_visitor<char> *visitor,error_code *ec)

{
  int iVar1;
  char *pcVar2;
  span<const_char,_18446744073709551615UL> sVar3;
  
  (this->parser_).more_ = true;
  do {
    if ((this->parser_).input_ptr_ == (this->parser_).input_end_) {
      sVar3 = text_source_adaptor<jsoncons::string_source<char>_>::read_buffer(&this->source_,ec);
      pcVar2 = sVar3.data_;
      iVar1 = ec->_M_value;
      if (sVar3.size_ != 0 && iVar1 == 0) {
        (this->parser_).begin_input_ = pcVar2;
        (this->parser_).input_end_ = pcVar2 + sVar3.size_;
        (this->parser_).input_ptr_ = pcVar2;
      }
      if (iVar1 != 0) {
        return;
      }
    }
    basic_csv_parser<char,_std::allocator<char>_>::parse_some(&this->parser_,visitor,ec);
    if (ec->_M_value != 0) {
      return;
    }
  } while (((this->parser_).more_ & 1U) != 0);
  return;
}

Assistant:

void read_next(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        parser_.restart();
        while (!parser_.stopped())
        {
            if (parser_.source_exhausted())
            {
                auto s = source_.read_buffer(ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
                if (s.size() > 0)
                {
                    parser_.update(s.data(),s.size());
                }
            }
            parser_.parse_some(visitor, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
        }
    }